

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  double *__ptr;
  N_Vector u;
  FILE *__stream;
  undefined8 *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  long lVar12;
  void *kmem;
  SUNContext sunctx;
  long nfe;
  long nni;
  long local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  __ptr = (double *)malloc(0x38);
  if (__ptr == (double *)0x0) {
    uVar9 = 0xffffffff;
    pcVar11 = "SetDefaults";
    goto LAB_00101b5a;
  }
  *__ptr = 1.4901161193847656e-06;
  __ptr[1] = 1.48219693752374e-322;
  __ptr[2] = 0.0;
  __ptr[3] = 0.0;
  *(undefined4 *)(__ptr + 4) = 0;
  __ptr[5] = 1.0;
  __ptr[6] = 1.0;
  uVar10 = 0;
  bVar4 = true;
  if (1 < argc) {
    lVar12 = 1;
    do {
      pcVar11 = argv[lVar12];
      iVar5 = strcmp(pcVar11,"--tol");
      if (iVar5 == 0) {
        dVar1 = atof(argv[lVar12 + 1]);
        *__ptr = dVar1;
      }
      else {
        iVar5 = strcmp(pcVar11,"--maxiter");
        if (iVar5 == 0) {
          iVar5 = atoi(argv[lVar12 + 1]);
          __ptr[1] = (double)(long)iVar5;
        }
        else {
          iVar5 = strcmp(pcVar11,"--m_aa");
          if (iVar5 == 0) {
            iVar5 = atoi(argv[lVar12 + 1]);
            __ptr[2] = (double)(long)iVar5;
          }
          else {
            iVar5 = strcmp(pcVar11,"--delay_aa");
            if (iVar5 == 0) {
              iVar5 = atoi(argv[lVar12 + 1]);
              __ptr[3] = (double)(long)iVar5;
            }
            else {
              iVar5 = strcmp(pcVar11,"--damping_fp");
              if (iVar5 == 0) {
                dVar1 = atof(argv[lVar12 + 1]);
                __ptr[5] = dVar1;
              }
              else {
                iVar5 = strcmp(pcVar11,"--damping_aa");
                if (iVar5 == 0) {
                  dVar1 = atof(argv[lVar12 + 1]);
                  __ptr[6] = dVar1;
                }
                else {
                  iVar5 = strcmp(pcVar11,"--orth_aa");
                  if (iVar5 != 0) {
                    iVar5 = strcmp(pcVar11,"--help");
                    if (iVar5 != 0) {
                      printf("Error: Invalid command line parameter %s\n",pcVar11);
                    }
                    InputHelp();
                    uVar10 = 0xffffffff;
                    bVar4 = false;
                    goto LAB_0010161a;
                  }
                  iVar5 = atoi(argv[lVar12 + 1]);
                  *(int *)(__ptr + 4) = iVar5;
                }
              }
            }
          }
        }
      }
      lVar12 = lVar12 + 2;
    } while ((int)lVar12 < argc);
    uVar10 = 0;
    bVar4 = true;
  }
LAB_0010161a:
  if (!bVar4) {
    fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n","ReadInputs",uVar10);
    free(__ptr);
    return 1;
  }
  puts("Solve the nonlinear system:");
  puts("    3x - cos((y-1)z) - 1/2 = 0");
  puts("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0");
  puts("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0");
  puts("Analytic solution:");
  printf("    x = %g\n",0);
  printf("    y = %g\n",0);
  printf("    z = %g\n",0x382d7370);
  puts("Solution method: Anderson accelerated fixed point iteration.");
  local_60 = *__ptr;
  printf("    tolerance    = %g\n");
  dVar1 = __ptr[1];
  printf("    max iters    = %ld\n",dVar1);
  dVar2 = __ptr[2];
  printf("    m_aa         = %ld\n",dVar2);
  dVar3 = __ptr[3];
  printf("    delay_aa     = %ld\n",dVar3);
  local_48 = __ptr[6];
  printf("    damping_aa   = %g\n");
  local_58 = __ptr[5];
  printf("    damping_fp   = %g\n");
  uVar7 = *(uint *)(__ptr + 4);
  printf("    orth routine = %d\n",(ulong)uVar7);
  uVar6 = SUNContext_Create(0,&local_68);
  if (uVar6 == 0) {
    u = (N_Vector)N_VNew_Serial(3,local_68);
    if (u == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    local_50 = dVar3;
    lVar12 = N_VClone(u);
    if (lVar12 == 0) {
      main_cold_4();
      return 1;
    }
    local_70 = KINCreate(local_68);
    if (local_70 == 0) {
      main_cold_3();
      return 1;
    }
    KINSetMAA(local_70,dVar2);
    uVar6 = KINSetOrthAA(local_70,uVar7);
    if (uVar6 == 0) {
      uVar6 = KINInit(local_70,FPFunction,u);
      if (uVar6 == 0) {
        uVar6 = KINSetFuncNormTol(SUB84(local_60,0),local_70);
        if (uVar6 == 0) {
          uVar6 = KINSetNumMaxIters(local_70,dVar1);
          if (uVar6 == 0) {
            if (dVar2 == 0.0) {
              KINSetDamping(SUB84(local_58,0),local_70);
            }
            if ((long)dVar2 < 1) {
LAB_0010185e:
              __stream = fopen("kinsol.log","w");
              if (__stream == (FILE *)0x0) {
                main_cold_2();
                return 1;
              }
              puVar8 = (undefined8 *)N_VGetArrayPointer(u);
              if (puVar8 == (undefined8 *)0x0) {
                main_cold_1();
                return 1;
              }
              *puVar8 = 0x3fb999999999999a;
              puVar8[1] = 0x3fb999999999999a;
              puVar8[2] = 0xbfb999999999999a;
              N_VConst(0,lVar12);
              uVar6 = KINSol(local_70,u,3,lVar12,lVar12);
              if (uVar6 == 0) {
                uVar7 = KINGetNumNonlinSolvIters(local_70,&local_38);
                if (uVar7 != 0) {
                  fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n",
                          "KINGetNumNonlinSolvIters",(ulong)uVar7);
                }
                uVar7 = KINGetNumFuncEvals(local_70,&local_40);
                if (uVar7 != 0) {
                  fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n","KINGetNumFuncEvals",
                          (ulong)uVar7);
                }
                puts("\nFinal Statistics:");
                printf("Number of nonlinear iterations: %6ld\n",local_38);
                printf("Number of function evaluations: %6ld\n",local_40);
                iVar5 = check_ans(u,local_60);
                fclose(__stream);
                N_VDestroy(u);
                N_VDestroy(lVar12);
                KINFree(&local_70);
                free(__ptr);
                SUNContext_Free(&local_68);
                return iVar5;
              }
              pcVar11 = "KINSol";
            }
            else {
              uVar6 = KINSetDampingAA(SUB84(local_48,0),local_70);
              if (uVar6 == 0) {
                uVar6 = KINSetDelayAA(local_70,local_50);
                if (uVar6 == 0) goto LAB_0010185e;
                pcVar11 = "KINSetDelayAA";
              }
              else {
                pcVar11 = "KINSetDampingAA";
              }
            }
          }
          else {
            pcVar11 = "KINSetNumMaxItersFuncNormTol";
          }
        }
        else {
          pcVar11 = "KINSetFuncNormTol";
        }
      }
      else {
        pcVar11 = "KINInit";
      }
    }
    else {
      pcVar11 = "KINSetOrthAA";
    }
  }
  else {
    pcVar11 = "SUNContext_Create";
  }
  uVar9 = (ulong)uVar6;
LAB_00101b5a:
  fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n",pcVar11,uVar9);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  int retval     = 0;    /* return value flag   */
  UserOpt uopt   = NULL; /* user options struct */
  N_Vector u     = NULL; /* solution vector     */
  N_Vector scale = NULL; /* scaling vector      */
  FILE* infofp   = NULL; /* KINSOL log file     */
  long int nni, nfe;     /* solver outputs      */
  sunrealtype* data;     /* vector data array   */
  void* kmem;            /* KINSOL memory       */

  /* Set default options */
  retval = SetDefaults(&uopt);
  if (check_retval(&retval, "SetDefaults", 1)) { return (1); }

  retval = ReadInputs(&argc, &argv, uopt);
  if (check_retval(&retval, "ReadInputs", 1))
  {
    free(uopt);
    return (1);
  }

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Solve the nonlinear system:\n");
  printf("    3x - cos((y-1)z) - 1/2 = 0\n");
  printf("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0\n");
  printf("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0\n");
  printf("Analytic solution:\n");
  printf("    x = %" GSYM "\n", XTRUE);
  printf("    y = %" GSYM "\n", YTRUE);
  printf("    z = %" GSYM "\n", ZTRUE);
  printf("Solution method: Anderson accelerated fixed point iteration.\n");
  printf("    tolerance    = %" GSYM "\n", uopt->tol);
  printf("    max iters    = %ld\n", uopt->maxiter);
  printf("    m_aa         = %ld\n", uopt->m_aa);
  printf("    delay_aa     = %ld\n", uopt->delay_aa);
  printf("    damping_aa   = %" GSYM "\n", uopt->damping_aa);
  printf("    damping_fp   = %" GSYM "\n", uopt->damping_fp);
  printf("    orth routine = %d\n", uopt->orth_aa);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VClone(u);
  if (check_retval((void*)scale, "N_VClone", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, uopt->m_aa);

  /* Set orthogonalization routine used in Anderson acceleration */
  retval = KINSetOrthAA(kmem, uopt->orth_aa);
  if (check_retval(&retval, "KINSetOrthAA", 1)) { return (1); }

  retval = KINInit(kmem, FPFunction, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */
  retval = KINSetFuncNormTol(kmem, uopt->tol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* Set maximum number of iterations */
  retval = KINSetNumMaxIters(kmem, uopt->maxiter);
  if (check_retval(&retval, "KINSetNumMaxItersFuncNormTol", 1)) { return (1); }

  /* Set Fixed point damping parameter */
  if (uopt->m_aa == 0) { retval = KINSetDamping(kmem, uopt->damping_fp); }

  /* Set Anderson acceleration options */
  if (uopt->m_aa > 0)
  {
    /* Set damping parameter */
    retval = KINSetDampingAA(kmem, uopt->damping_aa);
    if (check_retval(&retval, "KINSetDampingAA", 1)) { return (1); }

    /* Set acceleration delay */
    retval = KINSetDelayAA(kmem, uopt->delay_aa);
    if (check_retval(&retval, "KINSetDelayAA", 1)) { return (1); }
  }

  /* Set info log file and print level */
  infofp = fopen("kinsol.log", "w");
  if (check_retval((void*)infofp, "fopen", 0)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  /* Get vector data array */
  data = N_VGetArrayPointer(u);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return (1); }

  data[0] = PTONE;
  data[1] = PTONE;
  data[2] = -PTONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  u,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Get solver statistics
   * ------------------------------------ */

  /* get solver stats */
  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);

  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("Number of nonlinear iterations: %6ld\n", nni);
  printf("Number of function evaluations: %6ld\n", nfe);

  /* ------------------------------------
   * Print solution and check error
   * ------------------------------------ */

  /* check solution */
  retval = check_ans(u, uopt->tol);

  /* -----------
   * Free memory
   * ----------- */

  fclose(infofp);
  N_VDestroy(u);
  N_VDestroy(scale);
  KINFree(&kmem);
  free(uopt);
  SUNContext_Free(&sunctx);

  return (retval);
}